

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

Data __thiscall
QDateTimePrivate::create
          (QDateTimePrivate *this,QDate toDate,QTime toTime,QTimeZone *zone,
          TransitionResolution resolve)

{
  TransitionOptions resolve_00;
  
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::Data::Data((Data *)this,zone);
  setDateTime((QDateTimeData *)this,toDate,toTime);
  if ((*(int *)&zone->d - 1U & 3) - 1 < 2) {
    refreshSimpleDateTime((QDateTimeData *)this);
  }
  else {
    resolve_00 = toTransitionOptions(resolve);
    refreshZonedDateTime((QDateTimeData *)this,zone,resolve_00);
  }
  return (Data)this;
}

Assistant:

Q_NEVER_INLINE
QDateTime::Data QDateTimePrivate::create(QDate toDate, QTime toTime, const QTimeZone &zone,
                                         QDateTime::TransitionResolution resolve)
{
    QDateTime::Data result(zone);
    setDateTime(result, toDate, toTime);
    if (zone.isUtcOrFixedOffset())
        refreshSimpleDateTime(result);
    else
        refreshZonedDateTime(result, zone, toTransitionOptions(resolve));
    return result;
}